

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMullMusashi<(moira::Core)2,(moira::Instr)156,(moira::Mode)10,4>
          (Moira *this,u16 opcode)

{
  ushort uVar1;
  uint uVar2;
  u32 uVar3;
  ulong uVar4;
  u32 uVar5;
  u32 result;
  ulong uVar6;
  bool bVar7;
  
  uVar1 = (this->queue).irc;
  uVar5 = (this->reg).pc + 2;
  (this->reg).pc = uVar5;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar5);
  (this->queue).irc = (u16)uVar5;
  this->readBuffer = (u16)uVar5;
  uVar6 = (ulong)(uVar1 >> 0xc & 7);
  uVar5 = computeEA<(moira::Core)2,(moira::Mode)10,4,0ull>(this,opcode & 7);
  uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar5);
  uVar5 = (this->reg).pc;
  (this->reg).pc0 = uVar5;
  (this->queue).ird = (this->queue).irc;
  uVar5 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar5 + 2);
  (this->queue).irc = (u16)uVar5;
  this->readBuffer = (u16)uVar5;
  uVar2 = *(uint *)((long)&(this->reg).field_3 + uVar6 * 4);
  switch(uVar1 >> 10 & 3) {
  case 0:
    uVar4 = (ulong)uVar2 * (ulong)uVar3;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0x1f) & 1);
    (this->reg).sr.z = (int)uVar4 == 0;
    bVar7 = uVar4 >> 0x20 == 0;
    break;
  case 1:
    uVar4 = (ulong)uVar2 * (ulong)uVar3;
    (this->reg).sr.n = SUB81(uVar4 >> 0x3f,0);
    (this->reg).sr.z = uVar4 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4) = (int)(uVar4 >> 0x20);
    goto LAB_003dc93c;
  case 2:
    uVar4 = (long)(int)uVar2 * (long)(int)uVar3;
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0x1f) & 1);
    (this->reg).sr.z = (int)uVar4 == 0;
    bVar7 = (long)(int)uVar4 == uVar4;
    break;
  case 3:
    uVar4 = (long)(int)uVar2 * (long)(int)uVar3;
    (this->reg).sr.n = SUB81(uVar4 >> 0x3f,0);
    (this->reg).sr.z = uVar4 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    *(int *)((long)&(this->reg).field_3 + (ulong)(uVar1 & 7) * 4) = (int)(uVar4 >> 0x20);
    goto LAB_003dc93c;
  }
  (this->reg).sr.v = !bVar7;
  (this->reg).sr.c = false;
LAB_003dc93c:
  *(int *)((long)&(this->reg).field_3 + uVar6 * 4) = (int)uVar4;
  return;
}

Assistant:

void
Moira::execMullMusashi(u16 opcode)
{
    u64 result;
    u32 ea, data;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    readOp<C, M, S>(src, &ea, &data);

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:

            result = mullu<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b01:

            result = mullu<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;

        case 0b10:

            result = mulls<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b11:

            result = mulls<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;
    }
}